

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall
wasm_instance_t::wasm_instance_t(wasm_instance_t *this,RefPtr<wabt::interp::Instance> *ptr)

{
  RefPtr<wabt::interp::Object> local_30;
  RefPtr<wabt::interp::Instance> *local_18;
  RefPtr<wabt::interp::Instance> *ptr_local;
  wasm_instance_t *this_local;
  
  local_18 = ptr;
  ptr_local = (RefPtr<wabt::interp::Instance> *)this;
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Instance>(&local_30,ptr);
  wasm_ref_t::wasm_ref_t(&this->super_wasm_ref_t,&local_30);
  wabt::interp::RefPtr<wabt::interp::Object>::~RefPtr(&local_30);
  return;
}

Assistant:

wasm_instance_t(RefPtr<Instance> ptr) : wasm_ref_t(ptr) {}